

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int add_var_this(JSContext *ctx,JSFunctionDef *fd)

{
  undefined1 *puVar1;
  uint uVar2;
  
  uVar2 = add_var(ctx,fd,8);
  if ((-1 < (int)uVar2) && (fd->is_derived_class_constructor != 0)) {
    puVar1 = &fd->vars[uVar2].field_0xc;
    *(uint *)puVar1 = *(uint *)puVar1 | 2;
  }
  return uVar2;
}

Assistant:

static int add_var_this(JSContext *ctx, JSFunctionDef *fd)
{
    int idx;
    idx = add_var(ctx, fd, JS_ATOM_this);
    if (idx >= 0 && fd->is_derived_class_constructor) {
        JSVarDef *vd = &fd->vars[idx];
        /* XXX: should have is_this flag or var type */
        vd->is_lexical = 1; /* used to trigger 'uninitialized' checks
                               in a derived class constructor */
    }
    return idx;
}